

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O0

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitCallIndirect(InternalAnalyzer *this,CallIndirect *curr)

{
  bool bVar1;
  CallIndirect *curr_local;
  InternalAnalyzer *this_local;
  
  this->parent->calls = true;
  if ((curr->isReturn & 1U) != 0) {
    this->parent->branchesOut = true;
    bVar1 = FeatureSet::hasExceptionHandling(&this->parent->features);
    if (bVar1) {
      this->parent->hasReturnCallThrow = true;
    }
  }
  bVar1 = FeatureSet::hasExceptionHandling(&this->parent->features);
  if (((bVar1) && (this->parent->tryDepth == 0)) && ((curr->isReturn & 1U) == 0)) {
    this->parent->throws_ = true;
  }
  return;
}

Assistant:

void visitCallIndirect(CallIndirect* curr) {
      parent.calls = true;
      if (curr->isReturn) {
        parent.branchesOut = true;
        if (parent.features.hasExceptionHandling()) {
          parent.hasReturnCallThrow = true;
        }
      }
      if (parent.features.hasExceptionHandling() &&
          (parent.tryDepth == 0 && !curr->isReturn)) {
        parent.throws_ = true;
      }
    }